

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Intelligibility * webrtc::Config::default_value<webrtc::Intelligibility>(void)

{
  int iVar1;
  
  if (default_value<webrtc::Intelligibility>()::def == '\0') {
    iVar1 = __cxa_guard_acquire(&default_value<webrtc::Intelligibility>()::def);
    if (iVar1 != 0) {
      default_value<webrtc::Intelligibility>::def = (Intelligibility *)operator_new(1);
      default_value<webrtc::Intelligibility>::def->enabled = false;
      __cxa_guard_release(&default_value<webrtc::Intelligibility>()::def);
    }
  }
  return default_value<webrtc::Intelligibility>::def;
}

Assistant:

static const T& default_value() {
    RTC_DEFINE_STATIC_LOCAL(const T, def, ());
    return def;
  }